

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O2

void WAsmJs::RegisterSpace::GetTypeDebugName(Types type,char16 *buf,uint bufsize,bool shortName)

{
  char16_t *_Src;
  char16_t *pcVar1;
  
  switch(type) {
  case INT32:
    pcVar1 = L"I";
    _Src = L"INT32";
    break;
  case INT64:
    pcVar1 = L"L";
    _Src = L"INT64";
    break;
  case FLOAT32:
    pcVar1 = L"F";
    _Src = L"FLOAT32";
    break;
  case FLOAT64:
    pcVar1 = L"D";
    _Src = L"FLOAT64";
    break;
  case SIMD:
    _Src = L"SIMD";
    goto LAB_0087fe3d;
  default:
    _Src = L"UNKNOWN";
    goto LAB_0087fe3d;
  }
  if (shortName) {
    _Src = pcVar1;
  }
LAB_0087fe3d:
  wcscpy_s(buf,(ulong)bufsize,_Src);
  return;
}

Assistant:

void RegisterSpace::GetTypeDebugName(Types type, char16* buf, uint bufsize, bool shortName)
    {
        // Since this needs to be done manually for each type, this assert will make sure to not forget to update this if a new type is added
        CompileAssert(LIMIT == 5);

        switch (type)
        {
        case INT32: wcscpy_s(buf, bufsize  , shortName ? _u("I"): _u("INT32")); break;
        case INT64: wcscpy_s(buf, bufsize  , shortName ? _u("L"): _u("INT64")); break;
        case FLOAT32: wcscpy_s(buf, bufsize, shortName ? _u("F"): _u("FLOAT32")); break;
        case FLOAT64: wcscpy_s(buf, bufsize, shortName ? _u("D"): _u("FLOAT64")); break;
        case SIMD: wcscpy_s(buf, bufsize   , _u("SIMD")); break;
        default: wcscpy_s(buf, bufsize     , _u("UNKNOWN")); break;
        }
    }